

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetLowerBound(LoopDependenceAnalysis *this,Loop *loop)

{
  Op OVar1;
  Instruction *instruction;
  SENode *node;
  Instruction *local_30;
  Instruction *lower_inst;
  Instruction *cond_inst;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  instruction = Loop::GetConditionInst(loop);
  if (instruction == (Instruction *)0x0) {
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  else {
    local_30 = GetOperandDefinition(this,instruction,0);
    OVar1 = Instruction::opcode(instruction);
    if (OVar1 - OpUGreaterThan < 8) {
      OVar1 = Instruction::opcode(local_30);
      if (OVar1 == OpPhi) {
        local_30 = GetOperandDefinition(this,local_30,0);
        OVar1 = Instruction::opcode(local_30);
        if (OVar1 == OpPhi) {
          return (SENode *)0x0;
        }
      }
      node = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,local_30);
      this_local = (LoopDependenceAnalysis *)
                   ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,node);
    }
    else {
      this_local = (LoopDependenceAnalysis *)0x0;
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* LoopDependenceAnalysis::GetLowerBound(const Loop* loop) {
  Instruction* cond_inst = loop->GetConditionInst();
  if (!cond_inst) {
    return nullptr;
  }
  Instruction* lower_inst = GetOperandDefinition(cond_inst, 0);
  switch (cond_inst->opcode()) {
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan:
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan:
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      // If we have a phi we are looking at the induction variable. We look
      // through the phi to the initial value of the phi upon entering the loop.
      if (lower_inst->opcode() == spv::Op::OpPhi) {
        lower_inst = GetOperandDefinition(lower_inst, 0);
        // We don't handle looking through multiple phis.
        if (lower_inst->opcode() == spv::Op::OpPhi) {
          return nullptr;
        }
      }
      return scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(lower_inst));
    }
    default:
      return nullptr;
  }
}